

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapeBroadcastLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  bool bVar1;
  Type *pTVar2;
  mapped_type *pmVar3;
  ShapeRange *pSVar4;
  size_t sVar5;
  mapped_type *this_00;
  int i_1;
  int i;
  int iVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_01;
  RangeValue RVar7;
  ShapeRange local_100;
  RepeatedPtrFieldBase *local_e0;
  ShapeRange maxWidth;
  ShapeRange maxHeight;
  ShapeRange maxChannel;
  ShapeRange maxBatch;
  ShapeRange maxSequence;
  
  this_01 = &this->blobShapes;
  local_e0 = &(specLayer->input_).super_RepeatedPtrFieldBase;
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(local_e0,0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_01,pTVar2);
  pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
  maxSequence._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  maxSequence._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  maxSequence._minimum._val = (pSVar4->_minimum)._val;
  maxSequence._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  maxSequence._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  maxSequence._maximum._val = (pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::batchRange(pmVar3);
  maxBatch._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  maxBatch._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  maxBatch._minimum._val = (pSVar4->_minimum)._val;
  maxBatch._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  maxBatch._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  maxBatch._maximum._val = (pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::channelRange(pmVar3);
  maxChannel._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  maxChannel._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  maxChannel._minimum._val = (pSVar4->_minimum)._val;
  maxChannel._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  maxChannel._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  maxChannel._maximum._val = (pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::heightRange(pmVar3);
  maxHeight._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  maxHeight._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  maxHeight._minimum._val = (pSVar4->_minimum)._val;
  maxHeight._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  maxHeight._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  maxHeight._maximum._val = (pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::widthRange(pmVar3);
  maxWidth._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  maxWidth._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  maxWidth._minimum._val = (pSVar4->_minimum)._val;
  maxWidth._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  maxWidth._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  maxWidth._maximum._val = (pSVar4->_maximum)._val;
  bVar1 = ShapeConstraint::hasFixedCHW(pmVar3);
  iVar6 = 1;
  while( true ) {
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ <= iVar6) break;
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (local_e0,iVar6);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](this_01,pTVar2);
    if (bVar1 == false) {
      bVar1 = false;
    }
    else {
      bVar1 = ShapeConstraint::hasFixedCHW(pmVar3);
    }
    pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
    ShapeRange::intersect(&local_100,&maxSequence,pSVar4);
    maxSequence._minimum._1_7_ = local_100._minimum._1_7_;
    maxSequence._minimum._isUnbound = local_100._minimum._isUnbound;
    maxSequence._maximum._isUnbound = local_100._maximum._isUnbound;
    maxSequence._maximum._1_7_ = local_100._maximum._1_7_;
    maxSequence._maximum._val = local_100._maximum._val;
    maxSequence._minimum._val = local_100._minimum._val;
    pSVar4 = ShapeConstraint::batchRange(pmVar3);
    ShapeRange::intersect(&local_100,&maxBatch,pSVar4);
    maxBatch._minimum._1_7_ = local_100._minimum._1_7_;
    maxBatch._minimum._isUnbound = local_100._minimum._isUnbound;
    maxBatch._maximum._isUnbound = local_100._maximum._isUnbound;
    maxBatch._maximum._1_7_ = local_100._maximum._1_7_;
    maxBatch._maximum._val = local_100._maximum._val;
    maxBatch._minimum._val = local_100._minimum._val;
    pSVar4 = ShapeConstraint::channelRange(pmVar3);
    ShapeRange::unify(&local_100,&maxChannel,pSVar4);
    maxChannel._minimum._1_7_ = local_100._minimum._1_7_;
    maxChannel._minimum._isUnbound = local_100._minimum._isUnbound;
    maxChannel._maximum._isUnbound = local_100._maximum._isUnbound;
    maxChannel._maximum._1_7_ = local_100._maximum._1_7_;
    maxChannel._maximum._val = local_100._maximum._val;
    maxChannel._minimum._val = local_100._minimum._val;
    pSVar4 = ShapeConstraint::heightRange(pmVar3);
    ShapeRange::unify(&local_100,&maxHeight,pSVar4);
    maxHeight._minimum._1_7_ = local_100._minimum._1_7_;
    maxHeight._minimum._isUnbound = local_100._minimum._isUnbound;
    maxHeight._maximum._isUnbound = local_100._maximum._isUnbound;
    maxHeight._maximum._1_7_ = local_100._maximum._1_7_;
    maxHeight._maximum._val = local_100._maximum._val;
    maxHeight._minimum._val = local_100._minimum._val;
    pSVar4 = ShapeConstraint::widthRange(pmVar3);
    ShapeRange::unify(&local_100,&maxWidth,pSVar4);
    maxWidth._minimum._1_7_ = local_100._minimum._1_7_;
    maxWidth._minimum._isUnbound = local_100._minimum._isUnbound;
    maxWidth._minimum._val = local_100._minimum._val;
    maxWidth._maximum._isUnbound = local_100._maximum._isUnbound;
    maxWidth._maximum._1_7_ = local_100._maximum._1_7_;
    maxWidth._maximum._val = local_100._maximum._val;
    iVar6 = iVar6 + 1;
  }
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_01,pTVar2);
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(pmVar3,pTVar2);
  pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
  ShapeRange::intersect(&local_100,pSVar4,&maxSequence);
  ShapeConstraint::updateSequenceRange(pmVar3,&local_100);
  pSVar4 = ShapeConstraint::batchRange(pmVar3);
  ShapeRange::intersect(&local_100,pSVar4,&maxBatch);
  ShapeConstraint::updateBatchRange(pmVar3,&local_100);
  if (bVar1 == false) {
    pSVar4 = ShapeConstraint::channelRange(pmVar3);
    ShapeRange::intersect(&local_100,pSVar4,&maxChannel);
    ShapeConstraint::updateChannelRange(pmVar3,&local_100);
    pSVar4 = ShapeConstraint::heightRange(pmVar3);
    ShapeRange::intersect(&local_100,pSVar4,&maxHeight);
    ShapeConstraint::updateHeightRange(pmVar3,&local_100);
    pSVar4 = ShapeConstraint::widthRange(pmVar3);
    ShapeRange::intersect(&local_100,pSVar4,&maxWidth);
    ShapeConstraint::updateWidthRange(pmVar3,&local_100);
  }
  else {
    RVar7 = ShapeRange::maximum(&maxChannel);
    local_100._minimum._val = RVar7._val;
    local_100._minimum._isUnbound = RVar7._isUnbound;
    sVar5 = RangeValue::value(&local_100._minimum);
    ShapeConstraint::setChannel(pmVar3,sVar5);
    RVar7 = ShapeRange::maximum(&maxHeight);
    local_100._minimum._val = RVar7._val;
    local_100._minimum._isUnbound = RVar7._isUnbound;
    sVar5 = RangeValue::value(&local_100._minimum);
    ShapeConstraint::setHeight(pmVar3,sVar5);
    RVar7 = ShapeRange::maximum(&maxWidth);
    local_100._minimum._val = RVar7._val;
    local_100._minimum._isUnbound = RVar7._isUnbound;
    sVar5 = RangeValue::value(&local_100._minimum);
    ShapeConstraint::setWidth(pmVar3,sVar5);
  }
  for (iVar6 = 0; iVar6 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_;
      iVar6 = iVar6 + 1) {
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (local_e0,iVar6);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](this_01,pTVar2);
    pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
    ShapeConstraint::updateSequenceRange(this_00,pSVar4);
    pSVar4 = ShapeConstraint::batchRange(pmVar3);
    ShapeConstraint::updateBatchRange(this_00,pSVar4);
    bVar1 = ShapeConstraint::hasFixedCHW(this_00);
    if (!bVar1) {
      pSVar4 = ShapeConstraint::channelRange(pmVar3);
      ShapeConstraint::updateChannelRange(this_00,pSVar4);
      pSVar4 = ShapeConstraint::heightRange(pmVar3);
      ShapeConstraint::updateHeightRange(this_00,pSVar4);
      pSVar4 = ShapeConstraint::widthRange(pmVar3);
      ShapeConstraint::updateWidthRange(this_00,pSVar4);
    }
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeBroadcastLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& maxShape = blobShapes[specLayer.input(0)];

    ShapeRange maxSequence = maxShape.sequenceRange();
    ShapeRange maxBatch = maxShape.batchRange();
    ShapeRange maxChannel = maxShape.channelRange();
    ShapeRange maxHeight = maxShape.heightRange();
    ShapeRange maxWidth = maxShape.widthRange();

    bool inputShapesFixed = maxShape.hasFixedCHW();

    for (int i = 1; i < specLayer.input_size(); i++) {

        ShapeConstraint& inShape = blobShapes[specLayer.input(i)];

        inputShapesFixed = inputShapesFixed && inShape.hasFixedCHW();

        maxSequence = maxSequence.intersect(inShape.sequenceRange());
        maxBatch = maxBatch.intersect(inShape.batchRange());

        maxChannel = maxChannel.unify(inShape.channelRange());
        maxHeight = maxHeight.unify(inShape.heightRange());
        maxWidth = maxWidth.unify(inShape.widthRange());

    }

    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Broadcast layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Broadcast layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // Can there be ambiguity in the output of one of these? Yes.

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(maxSequence));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(maxBatch));

    if (inputShapesFixed) {
        outputShape.setChannel(maxChannel.maximum().value());
        outputShape.setHeight(maxHeight.maximum().value());
        outputShape.setWidth(maxWidth.maximum().value());
    }
    else {
        outputShape.updateChannelRange(outputShape.channelRange().intersect(maxChannel));
        outputShape.updateHeightRange(outputShape.heightRange().intersect(maxHeight));
        outputShape.updateWidthRange(outputShape.widthRange().intersect(maxWidth));
    }

    for (int i = 0; i < specLayer.input_size(); i++) {

        ShapeConstraint& inShape = blobShapes[specLayer.input(i)];
        inShape.updateSequenceRange(outputShape.sequenceRange());
        inShape.updateBatchRange(outputShape.batchRange());

        // Load constant followed by broadcast is a common pattern. If one of the inputs was from a
        // load constant layer, it will have a fixed shape, so we don't need to update shape information
        // in this case.

        if (!inShape.hasFixedCHW()) {
            inShape.updateChannelRange(outputShape.channelRange());
            inShape.updateHeightRange(outputShape.heightRange());
            inShape.updateWidthRange(outputShape.widthRange());
        }

    }


#if COREML_VALIDATOR_VERBOSE
    std::cout << "Broadcast layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Broadcast layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}